

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleClassifier::ByteSizeLong(TreeEnsembleClassifier *this)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  ClassLabelsCase CVar3;
  int size;
  size_t sVar4;
  long lVar5;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TreeEnsembleClassifier *this_local;
  
  _cached_size = 0;
  bVar1 = _internal_has_treeensemble(this);
  if (bVar1) {
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::TreeEnsembleParameters>(this->treeensemble_);
    _cached_size = _cached_size + 1;
  }
  TVar2 = _internal_postevaluationtransform(this);
  if (TVar2 != NoTransform) {
    TVar2 = _internal_postevaluationtransform(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(TVar2);
    _cached_size = sVar4 + 1 + _cached_size;
  }
  CVar3 = ClassLabels_case(this);
  if (CVar3 != CLASSLABELS_NOT_SET) {
    if (CVar3 == kStringClassLabels) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      _cached_size = sVar4 + 2 + _cached_size;
    }
    else if (CVar3 == kInt64ClassLabels) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      _cached_size = sVar4 + 2 + _cached_size;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    _cached_size = lVar5 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t TreeEnsembleClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleClassifier)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->_internal_has_treeensemble()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->_internal_postevaluationtransform() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_postevaluationtransform());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}